

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

void opj_tcd_makelayer(opj_tcd_t *tcd,OPJ_UINT32 layno,OPJ_FLOAT64 thresh,OPJ_UINT32 final)

{
  opj_tcd_cblk_enc_t *poVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  OPJ_UINT32 OVar5;
  OPJ_UINT32 OVar6;
  OPJ_UINT32 OVar7;
  OPJ_UINT32 OVar8;
  opj_tcd_tile_t *poVar9;
  opj_tcd_tilecomp_t *poVar10;
  opj_tcd_resolution_t *poVar11;
  opj_tcd_precinct_t *poVar12;
  opj_tcd_cblk_enc_t *poVar13;
  opj_tcd_pass_t *poVar14;
  bool bVar15;
  uint uVar16;
  OPJ_BYTE *pOVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  OPJ_UINT32 OVar24;
  long lVar25;
  opj_tcd_layer_t *poVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  double dVar30;
  OPJ_FLOAT64 OVar31;
  
  poVar9 = tcd->tcd_image->tiles;
  poVar9->distolayer[layno] = 0.0;
  uVar2 = poVar9->numcomps;
  for (uVar21 = 0; uVar21 != uVar2; uVar21 = uVar21 + 1) {
    poVar10 = poVar9->comps;
    uVar3 = poVar10[uVar21].numresolutions;
    for (uVar20 = 0; uVar20 != uVar3; uVar20 = uVar20 + 1) {
      poVar11 = poVar10[uVar21].resolutions;
      uVar4 = poVar11[uVar20].numbands;
      for (uVar19 = 0; uVar19 != uVar4; uVar19 = uVar19 + 1) {
        OVar5 = poVar11[uVar20].ph;
        OVar6 = poVar11[uVar20].pw;
        for (uVar18 = 0; uVar18 != OVar5 * OVar6; uVar18 = uVar18 + 1) {
          poVar12 = poVar11[uVar20].bands[uVar19].precincts;
          OVar7 = poVar12[uVar18].ch;
          OVar8 = poVar12[uVar18].cw;
          for (uVar22 = 0; uVar22 != OVar7 * OVar8; uVar22 = uVar22 + 1) {
            poVar13 = poVar12[uVar18].cblks.enc;
            poVar1 = poVar13 + uVar22;
            if (layno == 0) {
              poVar1->numpassesinlayers = 0;
              uVar23 = 0;
            }
            else {
              uVar23 = (ulong)poVar1->numpassesinlayers;
            }
            poVar26 = poVar13[uVar22].layers + layno;
            iVar27 = (int)uVar23;
            lVar25 = uVar23 * 0x18 + 8;
            uVar29 = uVar23;
            while( true ) {
              uVar28 = (uint)uVar29;
              if (poVar1->totalpasses <= uVar23) break;
              poVar14 = poVar1->passes;
              uVar16 = *(uint *)((long)poVar14 + lVar25 + -8);
              if (uVar28 == 0) {
                dVar30 = *(double *)((long)&poVar14->rate + lVar25);
              }
              else {
                uVar16 = uVar16 - poVar14[uVar28 - 1].rate;
                dVar30 = *(double *)((long)&poVar14->rate + lVar25) -
                         (double)poVar14[uVar28 - 1].distortiondec;
              }
              if (uVar16 == 0) {
                bVar15 = dVar30 != 0.0;
              }
              else {
                bVar15 = (double)thresh - dVar30 / (double)uVar16 < 2.220446049250313e-16;
              }
              uVar23 = uVar23 + 1;
              uVar16 = (uint)uVar23;
              if (!bVar15) {
                uVar16 = uVar28;
              }
              lVar25 = lVar25 + 0x18;
              uVar29 = (ulong)uVar16;
            }
            poVar26->numpasses = uVar28 - iVar27;
            if (uVar28 - iVar27 == 0) {
              poVar26->disto = 0.0;
            }
            else {
              uVar16 = uVar28 - 1;
              poVar14 = poVar1->passes;
              OVar24 = poVar14[uVar16].rate;
              if (iVar27 == 0) {
                pOVar17 = poVar1->data;
                OVar31 = poVar14[uVar16].distortiondec;
              }
              else {
                OVar24 = OVar24 - poVar14[iVar27 - 1U].rate;
                pOVar17 = poVar1->data + poVar14[iVar27 - 1U].rate;
                OVar31 = (OPJ_FLOAT64)
                         ((double)poVar14[uVar16].distortiondec -
                         (double)poVar14[iVar27 - 1U].distortiondec);
              }
              poVar26->len = OVar24;
              poVar26->data = pOVar17;
              poVar26->disto = OVar31;
              poVar9->distolayer[layno] =
                   (OPJ_FLOAT64)((double)OVar31 + (double)poVar9->distolayer[layno]);
              if (final != 0) {
                poVar1->numpassesinlayers = uVar28;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void opj_tcd_makelayer( opj_tcd_t *tcd,
                                                OPJ_UINT32 layno,
                                                OPJ_FLOAT64 thresh,
                                                OPJ_UINT32 final)
{
        OPJ_UINT32 compno, resno, bandno, precno, cblkno;
        OPJ_UINT32 passno;

        opj_tcd_tile_t *tcd_tile = tcd->tcd_image->tiles;

        tcd_tile->distolayer[layno] = 0;        /* fixed_quality */

        for (compno = 0; compno < tcd_tile->numcomps; compno++) {
                opj_tcd_tilecomp_t *tilec = &tcd_tile->comps[compno];

                for (resno = 0; resno < tilec->numresolutions; resno++) {
                        opj_tcd_resolution_t *res = &tilec->resolutions[resno];

                        for (bandno = 0; bandno < res->numbands; bandno++) {
                                opj_tcd_band_t *band = &res->bands[bandno];

                                for (precno = 0; precno < res->pw * res->ph; precno++) {
                                        opj_tcd_precinct_t *prc = &band->precincts[precno];

                                        for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
                                                opj_tcd_cblk_enc_t *cblk = &prc->cblks.enc[cblkno];
                                                opj_tcd_layer_t *layer = &cblk->layers[layno];
                                                OPJ_UINT32 n;

                                                if (layno == 0) {
                                                        cblk->numpassesinlayers = 0;
                                                }

                                                n = cblk->numpassesinlayers;

                                                for (passno = cblk->numpassesinlayers; passno < cblk->totalpasses; passno++) {
                                                        OPJ_UINT32 dr;
                                                        OPJ_FLOAT64 dd;
                                                        opj_tcd_pass_t *pass = &cblk->passes[passno];

                                                        if (n == 0) {
                                                                dr = pass->rate;
                                                                dd = pass->distortiondec;
                                                        } else {
                                                                dr = pass->rate - cblk->passes[n - 1].rate;
                                                                dd = pass->distortiondec - cblk->passes[n - 1].distortiondec;
                                                        }

                                                        if (!dr) {
                                                                if (dd != 0)
                                                                        n = passno + 1;
                                                                continue;
                                                        }
                                                        if (thresh - (dd / dr) < DBL_EPSILON) /* do not rely on float equality, check with DBL_EPSILON margin */
                                                                n = passno + 1;
                                                }

                                                layer->numpasses = n - cblk->numpassesinlayers;

                                                if (!layer->numpasses) {
                                                        layer->disto = 0;
                                                        continue;
                                                }

                                                if (cblk->numpassesinlayers == 0) {
                                                        layer->len = cblk->passes[n - 1].rate;
                                                        layer->data = cblk->data;
                                                        layer->disto = cblk->passes[n - 1].distortiondec;
                                                } else {
                                                        layer->len = cblk->passes[n - 1].rate - cblk->passes[cblk->numpassesinlayers - 1].rate;
                                                        layer->data = cblk->data + cblk->passes[cblk->numpassesinlayers - 1].rate;
                                                        layer->disto = cblk->passes[n - 1].distortiondec - cblk->passes[cblk->numpassesinlayers - 1].distortiondec;
                                                }

                                                tcd_tile->distolayer[layno] += layer->disto;    /* fixed_quality */

                                                if (final)
                                                        cblk->numpassesinlayers = n;
                                        }
                                }
                        }
                }
        }
}